

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

bool __thiscall
ON_SubD::DeleteComponentsForExperts
          (ON_SubD *this,ON_SubDComponentPtr *cptr_list,size_t cptr_count,bool bDeleteIsolatedEdges,
          bool bUpdateTagsAndCoefficients,bool bMarkDeletedFaceEdges)

{
  ON_SubDimple *pOVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ON_ComponentStatus OVar2;
  bool bVar3;
  uint uVar4;
  undefined7 in_register_00000009;
  size_t sVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  undefined7 in_register_00000081;
  ulong uVar9;
  long lVar10;
  undefined7 in_register_00000089;
  ulong uVar11;
  ulong *puVar12;
  uint max_level_index;
  ON_SubDComponentPtr cptr;
  ON_SubDComponentIterator cit;
  ON_ComponentStatus local_b2;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  undefined4 local_a4;
  ON_SubDComponentPtr local_a0;
  undefined4 local_94;
  ON_SubDimple *local_90;
  ON_SubDLevel *local_88;
  ON_SubDComponentIterator local_80;
  
  if ((int)CONCAT71(in_register_00000089,bMarkDeletedFaceEdges) != 0) {
    ClearComponentMarks(this,false,true,false,(ON_SimpleArray<const_ON_SubDComponentBase_*> *)0x0);
  }
  if (cptr_count == 0) {
    return true;
  }
  if (((cptr_list != (ON_SubDComponentPtr *)0x0) &&
      (pOVar1 = (this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr, pOVar1 != (ON_SubDimple *)0x0)) &&
     (uVar4 = (pOVar1->m_levels).m_count, uVar4 != 0)) {
    local_a4 = (undefined4)CONCAT71(in_register_00000009,bDeleteIsolatedEdges);
    sVar5 = 0;
    max_level_index = uVar4;
    do {
      uVar7 = cptr_list[sVar5].m_ptr & 0xfffffffffffffff8;
      if ((uVar7 != 0 && (cptr_list[sVar5].m_ptr & 6) != 0) &&
         (uVar6 = (uint)*(byte *)(uVar7 + 0x13), uVar6 <= max_level_index)) {
        max_level_index = uVar6;
      }
      sVar5 = sVar5 + 1;
    } while (cptr_count != sVar5);
    if ((max_level_index != uVar4) && (max_level_index < uVar4)) {
      pOVar1->m_active_level = (pOVar1->m_levels).m_a[max_level_index];
      local_90 = pOVar1;
      ON_SubDimple::ClearHigherSubdivisionLevels(pOVar1,max_level_index);
      local_88 = local_90->m_active_level;
      if ((local_88 != (ON_SubDLevel *)0x0) && (local_88->m_level_index == max_level_index)) {
        local_94 = (undefined4)CONCAT71(in_register_00000081,bUpdateTagsAndCoefficients);
        ON_SubDComponentIterator::ON_SubDComponentIterator(&local_80,this);
        local_a0 = ON_SubDComponentIterator::FirstComponent(&local_80);
        while ((OVar2 = ON_ComponentStatus::AllSet, 7 < local_a0.m_ptr &&
               ((local_a0.m_ptr & 6) != 0))) {
          local_b2 = ON_SubDComponentPtr::Status(&local_a0);
          bVar3 = ON_ComponentStatus::operator==(&ON_ComponentStatus::AllSet,&local_b2);
          if (bVar3) {
            ON_SubDComponentPtr::ClearStates(&local_a0,ON_ComponentStatus::Damaged);
          }
          local_a0 = ON_SubDComponentIterator::NextComponent(&local_80);
        }
        sVar5 = 0;
        do {
          uVar9 = cptr_list[sVar5].m_ptr & 6;
          uVar7 = cptr_list[sVar5].m_ptr & 0xfffffffffffffff8;
          if ((uVar7 != 0 && uVar9 != 0) && (max_level_index == *(byte *)(uVar7 + 0x13))) {
            *(ON_ComponentStatus *)(uVar7 + 0x10) = OVar2;
            iVar8 = (int)uVar9;
            switch(uVar9) {
            case 2:
              if (uVar7 != 0 && iVar8 == 2) {
                if (*(short *)(uVar7 + 0x68) != 0) {
                  uVar9 = 0;
                  do {
                    uVar11 = *(ulong *)(*(long *)(uVar7 + 0x70) + uVar9 * 8) & 0xfffffffffffffff8;
                    if (uVar11 != 0) {
                      *(ON_ComponentStatus *)(uVar11 + 0x10) = OVar2;
                    }
                    uVar9 = uVar9 + 1;
                  } while (uVar9 < *(ushort *)(uVar7 + 0x68));
                }
                if (*(short *)(uVar7 + 0x6a) != 0) {
                  uVar9 = 0;
                  do {
                    lVar10 = *(long *)(*(long *)(uVar7 + 0x78) + uVar9 * 8);
                    if (lVar10 != 0) {
                      *(ON_ComponentStatus *)(lVar10 + 0x10) = OVar2;
                    }
                    uVar9 = uVar9 + 1;
                  } while (uVar9 < *(ushort *)(uVar7 + 0x6a));
                }
              }
              break;
            case 4:
              if (uVar7 != 0 && iVar8 == 4) {
                *(ON_ComponentStatus *)(uVar7 + 0x10) = OVar2;
                uVar9 = (ulong)*(ushort *)(uVar7 + 100);
                if (*(ushort *)(uVar7 + 100) != 0) {
                  lVar10 = -0x10;
                  uVar11 = 0;
                  do {
                    if (uVar11 < 2) {
                      puVar12 = (ulong *)(uVar7 + 0x68 + uVar11 * 8);
LAB_005ee00c:
                      uVar9 = *puVar12 & 0xfffffffffffffff8;
                    }
                    else {
                      if (uVar11 < uVar9) {
                        puVar12 = (ulong *)(*(long *)(uVar7 + 0x78) + lVar10);
                        goto LAB_005ee00c;
                      }
                      uVar9 = 0;
                    }
                    if (uVar9 != 0) {
                      *(ON_ComponentStatus *)(uVar9 + 0x10) = OVar2;
                    }
                    uVar11 = uVar11 + 1;
                    uVar9 = (ulong)*(ushort *)(uVar7 + 100);
                    lVar10 = lVar10 + 8;
                  } while (uVar11 < uVar9);
                }
              }
              break;
            case 6:
              if (uVar7 != 0 && iVar8 == 6) {
                *(ON_ComponentStatus *)(uVar7 + 0x10) = OVar2;
              }
            }
          }
          sVar5 = sVar5 + 1;
        } while (sVar5 != cptr_count);
        local_a0 = ON_SubDComponentIterator::FirstComponent(&local_80);
        local_a8 = 0;
        local_b0 = 0;
        local_ac = 0;
        while ((pOVar1 = local_90, 7 < local_a0.m_ptr &&
               (uVar4 = (uint)local_a0.m_ptr, (local_a0.m_ptr & 6) != 0))) {
          local_b2 = ON_SubDComponentPtr::Status(&local_a0);
          bVar3 = ON_ComponentStatus::operator==(&ON_ComponentStatus::AllSet,&local_b2);
          if (bVar3) {
            switch(uVar4 & 6) {
            case 2:
              local_a8 = local_a8 + 1;
              break;
            case 4:
              local_b0 = local_b0 + 1;
              break;
            case 6:
              local_ac = local_ac + 1;
            }
          }
          local_a0 = ON_SubDComponentIterator::NextComponent(&local_80);
        }
        if ((local_a8 == 0 && local_b0 == 0) && local_ac == 0) {
          bVar3 = false;
        }
        else {
          if (((local_a8 < local_88->m_vertex_count) && (local_b0 < local_88->m_edge_count)) &&
             (SUB41(local_a4,0) != true || local_ac < local_88->m_face_count)) {
            uVar4 = ON_SubDimple::DeleteComponents
                              (local_90,max_level_index,SUB41(local_a4,0),local_94._0_1_,
                               bMarkDeletedFaceEdges);
            if ((pOVar1->m_levels).m_count != 0) {
              bVar3 = uVar4 != 0;
              if (uVar4 != 0 || max_level_index != 0) {
                ON_SubDimple::ClearLowerSubdivisionLevels(pOVar1,max_level_index);
              }
              goto LAB_005ee170;
            }
          }
          this_00 = (this->m_subdimple_sp).
                    super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          (this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)0x0;
          (this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          bVar3 = true;
        }
LAB_005ee170:
        ON_SubDRef::~ON_SubDRef(&local_80.m_subd_ref);
        return bVar3;
      }
    }
  }
  ON_SubDIncrementErrorCount();
  return false;
}

Assistant:

bool ON_SubD::DeleteComponentsForExperts(
  const ON_SubDComponentPtr* cptr_list,
  size_t cptr_count,
  bool bDeleteIsolatedEdges,
  bool bUpdateTagsAndCoefficients,
  bool bMarkDeletedFaceEdges
)
{
  if (bMarkDeletedFaceEdges)
    ClearComponentMarks(false,true,false,nullptr);

  if ( cptr_count <= 0 )
    return true;

  if ( nullptr == cptr_list )
    return ON_SUBD_RETURN_ERROR(false);

  ON_SubDimple* subdimple = SubDimple(false);
  if ( nullptr == subdimple )
    return ON_SUBD_RETURN_ERROR(false);

  const unsigned int level_count = subdimple->LevelCount();
  if (level_count <= 0)
    return ON_SUBD_RETURN_ERROR(false);
  
  unsigned level_index = level_count;
  for (size_t i = 0; i < cptr_count; i++)
  {
    const ON_SubDComponentBase* c = cptr_list[i].ComponentBase();
    if ( nullptr == c)
      continue;
    if ( c->SubdivisionLevel() < level_index )
      level_index = c->SubdivisionLevel();
  }
  if ( level_index == level_count )
    return ON_SUBD_RETURN_ERROR(false);

  if ( false == subdimple->SetActiveLevel(level_index) )
    return ON_SUBD_RETURN_ERROR(false);

  subdimple->ClearHigherSubdivisionLevels(level_index);
  const ON_SubDLevel* level = subdimple->ActiveLevelPointer();
  if ( nullptr == level || level->m_level_index != level_index)
    return ON_SUBD_RETURN_ERROR(false);

  // Make sure no components have a status = ON_ComponentStatus::AllSet
  // because this uncommon status value is used to mark components that will be be deleted.
  ON_SubDComponentIterator cit(*this);
  for (ON_SubDComponentPtr cptr = cit.FirstComponent(); cptr.IsNotNull(); cptr = cit.NextComponent())
  {
    if ( ON_ComponentStatus::AllSet == cptr.Status() )
      cptr.ClearStates(ON_ComponentStatus::Damaged);
  }

  // Set the status of every component in cptr_list[] to ON_ComponentStatus::AllSet.
  // If that component is a vertex, set the status of every edge and face that
  // touch the vertex to ON_ComponentStatus::AllSet.
  // If that component is an edge, set the status of every face that
  // touches the edge to ON_ComponentStatus::AllSet.
  for (size_t i = 0; i < cptr_count; i++)
  {
    ON_SubDComponentPtr cptr = cptr_list[i];
    const ON_SubDComponentBase* c = cptr.ComponentBase();
    if (nullptr == c)
      continue;
    if (c->SubdivisionLevel() != level_index)
      continue;
    c->m_status = ON_ComponentStatus::AllSet;
    switch (cptr.ComponentType())
    {
    case ON_SubDComponentPtr::Type::Vertex:
      {
        const ON_SubDVertex* vertex = cptr.Vertex();
        if (nullptr == vertex)
          continue;
        for (unsigned short vei = 0; vei < vertex->m_edge_count; vei++)
        {
          const ON_SubDEdge* edge = vertex->Edge(vei);
          if (nullptr == edge)
            continue;
          edge->m_status = ON_ComponentStatus::AllSet;
        }
        for (unsigned short vfi = 0; vfi < vertex->m_face_count; vfi++)
        {
          const ON_SubDFace* face = vertex->Face(vfi);
          if (nullptr == face)
            continue;
          face->m_status = ON_ComponentStatus::AllSet;
        }
      }
      break;

    case ON_SubDComponentPtr::Type::Edge:
      {
        const ON_SubDEdge* edge = cptr.Edge();
        if (nullptr == edge)
          continue;
        edge->m_status = ON_ComponentStatus::AllSet;
        for (unsigned short efi = 0; efi < edge->m_face_count; efi++)
        {
          const ON_SubDFace* face = edge->Face(efi);
          if (nullptr == face)
            continue;
          face->m_status = ON_ComponentStatus::AllSet;
        }
      }
      break;

    case ON_SubDComponentPtr::Type::Face:
      {
        const ON_SubDFace* face = cptr.Face();
        if (nullptr == face)
          continue;
        face->m_status = ON_ComponentStatus::AllSet;
      }
      break;
            
    case ON_SubDComponentPtr::Type::Unset:
      break;
    }
  }

  // Minimum count of what will be deleted. (
  unsigned int deleted_vertex_count = 0;
  unsigned int deleted_edge_count = 0;
  unsigned int deleted_face_count = 0;
  for (ON_SubDComponentPtr cptr = cit.FirstComponent(); cptr.IsNotNull(); cptr = cit.NextComponent())
  {
    if (ON_ComponentStatus::AllSet == cptr.Status())
    {
      switch (cptr.ComponentType())
      {
      case ON_SubDComponentPtr::Type::Vertex:
        deleted_vertex_count++;
        break;

      case ON_SubDComponentPtr::Type::Edge:
        deleted_edge_count++;
        break;

      case ON_SubDComponentPtr::Type::Face:
        deleted_face_count++;
        break;
      case ON_SubDComponentPtr::Type::Unset:
        break;
      }
      continue;
    }
  }

  if ( 0 == deleted_vertex_count && 0 == deleted_edge_count && 0 ==  deleted_face_count )
    return false;

  const bool bDestroy
    = deleted_vertex_count >= level->m_vertex_count
    || deleted_edge_count >= level->m_edge_count
    || (deleted_face_count >= level->m_face_count && bDeleteIsolatedEdges)
    ;
  if (bDestroy)
  {
    Destroy();
    return true;
  }

  unsigned int deleted_component_count = subdimple->DeleteComponents(level_index,bDeleteIsolatedEdges,bUpdateTagsAndCoefficients,bMarkDeletedFaceEdges);

  if (0 == subdimple->LevelCount())
  {
    Destroy();
    return true;
  }

  if (deleted_component_count > 0 || level_index > 0)
  {
    // remove lower levels
    subdimple->ClearLowerSubdivisionLevels(level_index);
  }

  return (deleted_component_count > 0);
}